

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_builder.hpp
# Opt level: O2

vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
* __thiscall
pico_tree::internal::
build_rkd_tree<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>,128ul>
::operator()(vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
             *__return_storage_ptr__,void *this,
            space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>_>_>
            space,splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *rule,size_t forest_size)

{
  space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>_>_>
  space_00;
  size_t extraout_RDX;
  size_t dim;
  size_t extraout_RDX_00;
  bool bVar1;
  space_type s;
  kd_tree_data_type t;
  point<float,_128UL> r;
  size_t local_cf8;
  _Vector_base<float,_std::allocator<float>_> local_cf0;
  kd_tree_data_type local_cd8;
  rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL> local_890;
  rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul> local_230 [512];
  
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  space_00.space_ = (space_type *)stop_condition;
  std::
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  ::reserve(__return_storage_ptr__,forest_size);
  dim = extraout_RDX;
  while (bVar1 = forest_size != 0, forest_size = forest_size - 1, bVar1) {
    random_normal<float,128ul>((point<float,_128UL> *)local_230,(internal *)0x80,dim);
    rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>::
    rotate_space<pico_tree::internal::space_wrapper<std::reference_wrapper<std::vector<std::array<float,128ul>,std::allocator<std::array<float,128ul>>>const>>>
              ((space_type *)&local_cf8,local_230,(rotation_type *)space.space_,space_00);
    space_00.space_ = (space_type *)stop_condition;
    build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>,128ul>
    ::operator()(&local_cd8,&local_890,(space_type *)&local_cf8,stop_condition,start_bounds,rule);
    memcpy(&local_890,local_230,0x200);
    local_890.space.storage_.size = local_cf8;
    local_890.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = local_cf0._M_impl.super__Vector_impl_data._M_start;
    local_890.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = local_cf0._M_impl.super__Vector_impl_data._M_finish;
    local_890.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_cf0._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_cf0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_cf0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_cf0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_890.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_890.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_890.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    memcpy(&local_890.tree.root_box,&local_cd8.root_box,0x400);
    local_890.tree.allocator.resource_._vptr_list_pool_resource =
         (_func_int **)&PTR__list_pool_resource_00112d80;
    local_890.tree.allocator.resource_.head_ = local_cd8.allocator.resource_.head_;
    local_cd8.allocator.resource_.head_ = (node *)0x0;
    local_890.tree.allocator.object_index_ = local_cd8.allocator.object_index_;
    local_890.tree.allocator.chunk_ = local_cd8.allocator.chunk_;
    local_890.tree.root_node = local_cd8.root_node;
    ::std::
    vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>,std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>>>
    ::
    emplace_back<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>>
              ((vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>,std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>>>
                *)__return_storage_ptr__,&local_890);
    rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>::
    ~rkd_tree_hh_data(&local_890);
    kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>::~kd_tree_data
              (&local_cd8);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_cf0);
    dim = extraout_RDX_00;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<rkd_tree_data_type> operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const& rule,
      size_t forest_size) {
    assert(forest_size > 0);

    using space_wrapper_type = typename rkd_tree_data_type::space_wrapper_type;
    using build_kd_tree_type = build_kd_tree<kd_tree_data_type, Dim_>;

    std::vector<rkd_tree_data_type> trees;
    trees.reserve(forest_size);
    for (std::size_t i = 0; i < forest_size; ++i) {
      auto r = rkd_tree_data_type::random_rotation(space);
      auto s = rkd_tree_data_type::rotate_space(r, space);
      auto t = build_kd_tree_type()(
          space_wrapper_type(s), stop_condition, start_bounds, rule);
      trees.push_back({std::move(r), std::move(s), std::move(t)});
    }
    return trees;
  }